

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

_Bool ggml_is_contiguous_n(ggml_tensor *tensor,int n)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  _Bool _Var5;
  
  if ((tensor->ne[0] == type_traits[tensor->type].blck_size) ||
     (tensor->nb[0] == type_traits[tensor->type].type_size)) {
    sVar2 = (tensor->ne[0] / type_traits[tensor->type].blck_size) *
            type_traits[tensor->type].type_size;
    _Var5 = false;
    uVar3 = 0;
    do {
      uVar4 = uVar3 + 1;
      lVar1 = tensor->ne[uVar3 + 1];
      if (lVar1 != 1) {
        if ((long)n < (long)uVar4) {
          if (tensor->nb[uVar3 + 1] != sVar2) {
            return _Var5;
          }
          sVar2 = sVar2 * lVar1;
        }
        else {
          sVar2 = lVar1 * tensor->nb[uVar3 + 1];
        }
      }
      _Var5 = 2 < uVar4;
      uVar3 = uVar4;
    } while (uVar4 != 3);
  }
  else {
    _Var5 = false;
  }
  return _Var5;
}

Assistant:

static bool ggml_is_contiguous_n(const struct ggml_tensor * tensor, int n) {
    size_t next_nb = ggml_type_size(tensor->type);
    if (tensor->ne[0] != ggml_blck_size(tensor->type) && tensor->nb[0] != next_nb) {
        return false;
    }
    next_nb *= tensor->ne[0]/ggml_blck_size(tensor->type);
    for (int i = 1; i < GGML_MAX_DIMS; i++) {
        if (tensor->ne[i] != 1) {
            if (i > n) {
                if (tensor->nb[i] != next_nb) {
                    return false;
                }
                next_nb *= tensor->ne[i];
            } else {
                // this dimension does not need to be contiguous
                next_nb = tensor->ne[i]*tensor->nb[i];
            }
        }
    }
    return true;
}